

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatch.cxx
# Opt level: O2

void __thiscall
cmVariableWatch::RemoveWatch
          (cmVariableWatch *this,string *variable,WatchMethod method,void *client_data)

{
  Pair *this_00;
  size_type sVar1;
  mapped_type *this_01;
  const_iterator __position;
  
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>_>_>
          ::count(&this->WatchMap,variable);
  if (sVar1 != 0) {
    this_01 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>_>_>
              ::operator[](&this->WatchMap,variable);
    for (__position._M_current =
              (this_01->
              super__Vector_base<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>)
              ._M_impl.super__Vector_impl_data._M_start;
        __position._M_current !=
        (this_01->
        super__Vector_base<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>).
        _M_impl.super__Vector_impl_data._M_finish; __position._M_current = __position._M_current + 1
        ) {
      this_00 = *__position._M_current;
      if ((this_00->Method == method) &&
         ((client_data == (void *)0x0 || (this_00->ClientData == client_data)))) {
        Pair::~Pair(this_00);
        operator_delete(this_00,0x18);
        std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>::erase
                  (this_01,__position);
        return;
      }
    }
  }
  return;
}

Assistant:

void cmVariableWatch::RemoveWatch(const std::string& variable,
                                  WatchMethod method,
                                  void* client_data /*=0*/)
{
  if ( !this->WatchMap.count(variable) )
    {
    return;
    }
  cmVariableWatch::VectorOfPairs* vp = &this->WatchMap[variable];
  cmVariableWatch::VectorOfPairs::iterator it;
  for ( it = vp->begin(); it != vp->end(); ++it )
    {
    if ( (*it)->Method == method &&
         // If client_data is NULL, we want to disconnect all watches against
         // the given method; otherwise match ClientData as well.
         (!client_data || (client_data == (*it)->ClientData)))
      {
      delete *it;
      vp->erase(it);
      return;
      }
    }
}